

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.hh
# Opt level: O2

size_t __thiscall tinyusdz::tydra::VertexAttribute::vertex_count(VertexAttribute *this)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((ulong)this->stride == 0) {
    sVar1 = stride_bytes(this);
    uVar2 = (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar3 = uVar2 / sVar1;
    if (uVar2 % sVar1 != 0) {
      uVar3 = 0;
    }
  }
  else {
    uVar3 = (ulong)((long)(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) / (ulong)this->stride;
  }
  return uVar3;
}

Assistant:

size_t vertex_count() const {
    if (stride != 0) {
      // TODO: return 0 when (data.size() % stride) != 0?
      return data.size() / stride;
    }

    size_t itemSize = stride_bytes();

    if ((data.size() % itemSize) != 0) {
      // data size mismatch
      return 0;
    }

    return data.size() / itemSize;
  }